

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadAnimationClipLibrary(ColladaParser *this)

{
  size_type *psVar1;
  _func_int *p_Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar6;
  size_t sVar7;
  undefined4 extraout_var_03;
  undefined8 *puVar8;
  undefined4 extraout_var_04;
  ulong uVar9;
  string animName;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  clip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  undefined1 *local_1f0;
  char *local_1e8;
  undefined1 local_1e0 [16];
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  AnimationClipLibrary *local_1b0;
  undefined1 local_1a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188 [3];
  ios_base local_138 [264];
  undefined4 extraout_var_02;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar3 != '\0')) {
    local_1b0 = &this->mAnimationClipLibrary;
    do {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) {
        if (iVar4 != 1) {
LAB_003f05bc:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"animation_clip");
        if (iVar3 == 0) {
          local_1f0 = local_1e0;
          local_1e8 = (char *)0x0;
          local_1e0[0] = 0;
          iVar3 = TestAttribute(this,"name");
          iVar4 = TestAttribute(this,"id");
          if ((iVar3 < 0) && (iVar4 < 0)) {
            local_210 = local_200;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"animation_","");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            uVar9 = 0xf;
            if (local_210 != local_200) {
              uVar9 = local_200[0];
            }
            if (uVar9 < (ulong)(local_1c8 + local_208)) {
              uVar9 = 0xf;
              if (local_1d0 != local_1c0) {
                uVar9 = local_1c0[0];
              }
              if (uVar9 < (ulong)(local_1c8 + local_208)) goto LAB_003f04dc;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_210);
            }
            else {
LAB_003f04dc:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1d0);
            }
            psVar1 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_230.field_2._M_allocated_capacity = *psVar1;
              local_230.field_2._8_8_ = puVar8[3];
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            }
            else {
              local_230.field_2._M_allocated_capacity = *psVar1;
              local_230._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_230._M_string_length = puVar8[1];
            *puVar8 = psVar1;
            puVar8[1] = 0;
            *(undefined1 *)psVar1 = 0;
            std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p);
            }
            if (local_1d0 != local_1c0) {
              operator_delete(local_1d0);
            }
            if (local_210 != local_200) {
              operator_delete(local_210);
            }
          }
          else {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            pcVar6 = local_1e8;
            strlen((char *)CONCAT44(extraout_var_00,iVar3));
            std::__cxx11::string::_M_replace
                      ((ulong)&local_1f0,0,pcVar6,CONCAT44(extraout_var_00,iVar3));
          }
          local_1a8._0_8_ = local_1a8 + 0x10;
          local_1a8._8_8_ = 0;
          local_1a8[0x10] = '\0';
          local_188[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_188[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_188[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::__cxx11::string::_M_assign((string *)local_1a8);
          do {
            while( true ) {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
              if ((char)iVar3 == '\0') goto LAB_003f0397;
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              p_Var2 = this->mReader->_vptr_IIrrXMLReader[3];
              if (iVar3 != 1) break;
              iVar3 = (*p_Var2)();
              if (iVar3 != 1) goto LAB_003f05bc;
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"instance_animation");
              if (iVar3 == 0) {
                uVar5 = TestAttribute(this,"url");
                if (-1 < (int)uVar5) {
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
                  pcVar6 = (char *)CONCAT44(extraout_var_02,iVar3);
                  if (*pcVar6 != '#') {
                    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_230,"Unknown reference format","");
                    ThrowException(this,&local_230);
                  }
                  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                  sVar7 = strlen(pcVar6 + 1);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_230,pcVar6 + 1,pcVar6 + sVar7 + 1);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_188,&local_230);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != &local_230.field_2) {
                    operator_delete(local_230._M_dataplus._M_p);
                  }
                }
              }
              else {
                SkipElement(this);
              }
            }
            iVar3 = (*p_Var2)();
          } while (iVar3 != 2);
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"animation_clip");
          if (iVar3 != 0) {
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_230,"Expected end of <animation_clip> element.","");
            ThrowException(this,&local_230);
          }
LAB_003f0397:
          if (local_188[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_188[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::push_back(local_1b0,(value_type *)local_1a8);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(local_188);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_);
          }
          if (local_1f0 != local_1e0) {
            operator_delete(local_1f0);
          }
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar4 == 2) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var_04,iVar3),"library_animation_clips");
        if (iVar3 == 0) {
          return;
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Expected end of <library_animation_clips> element.","");
        ThrowException(this,(string *)local_1a8);
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar3 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadAnimationClipLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("animation_clip"))
            {
                // optional name given as an attribute
                std::string animName;
                int indexName = TestAttribute("name");
                int indexID = TestAttribute("id");
                if (indexName >= 0)
                    animName = mReader->getAttributeValue(indexName);
                else if (indexID >= 0)
                    animName = mReader->getAttributeValue(indexID);
                else
                    animName = std::string("animation_") + to_string(mAnimationClipLibrary.size());

                std::pair<std::string, std::vector<std::string> > clip;

                clip.first = animName;

                while (mReader->read())
                {
                    if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
                    {
                        if (IsElement("instance_animation"))
                        {
                            int indexUrl = TestAttribute("url");
                            if (indexUrl >= 0)
                            {
                                const char* url = mReader->getAttributeValue(indexUrl);
                                if (url[0] != '#')
                                    ThrowException("Unknown reference format");

                                url++;

                                clip.second.push_back(url);
                            }
                        }
                        else
                        {
                            // ignore the rest
                            SkipElement();
                        }
                    }
                    else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
                    {
                        if (strcmp(mReader->getNodeName(), "animation_clip") != 0)
                            ThrowException("Expected end of <animation_clip> element.");

                        break;
                    }
                }

                if (clip.second.size() > 0)
                {
                    mAnimationClipLibrary.push_back(clip);
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_animation_clips") != 0)
                ThrowException("Expected end of <library_animation_clips> element.");

            break;
        }
    }
}